

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O3

bool __thiscall ritobin::io::impl_binary_read::BinBinaryReader::read_entries(BinBinaryReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  uint *puVar5;
  size_type sVar6;
  undefined8 uVar7;
  size_type sVar8;
  pointer pFVar9;
  pointer pFVar10;
  pointer pFVar11;
  bool bVar12;
  uint *pos;
  pointer puVar13;
  char *pcVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> entryNameHashes;
  FNV1a local_208;
  Embed local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  pointer local_178;
  undefined1 local_170 [64];
  __index_type local_130;
  undefined1 local_128 [64];
  __index_type local_e8;
  undefined1 local_e0 [64];
  __index_type local_a0;
  undefined1 local_98 [64];
  __index_type local_58;
  undefined2 local_50 [4];
  vector<ritobin::Pair,_std::allocator<ritobin::Pair>_> local_48;
  
  local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar5 = (uint *)(this->reader).cur_;
  pos = puVar5 + 1;
  if ((this->reader).cap_ < pos) {
    pcVar14 = "reader.read(entryCount)";
    pos = puVar5;
  }
  else {
    uVar4 = *puVar5;
    (this->reader).cur_ = (char *)pos;
    bVar12 = BinaryReader::read<unsigned_int>(&this->reader,&local_198,(ulong)uVar4);
    if (bVar12) {
      local_50[0] = 0x8311;
      local_48.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178 = local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar1 = &local_1d8.name.str_.field_2;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_128 + 0x18);
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_170 + 0x18);
        puVar13 = local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          paVar15 = &local_208.str_.field_2;
          local_1d8.name.hash_ = *puVar13;
          local_208.hash_ = 0;
          local_208._4_4_ = 0;
          local_208.str_.field_2._8_8_ = 0;
          local_208.str_._M_string_length = 0;
          local_208.str_.field_2._M_allocated_capacity = 0;
          local_1d8.name.str_._M_string_length = 0;
          local_1d8.name.str_.field_2._M_local_buf[0] = '\0';
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pcVar14 = (this->reader).cur_;
          local_208.str_._M_dataplus._M_p = (pointer)paVar15;
          local_1d8.name.str_._M_dataplus._M_p = (pointer)paVar1;
          bVar12 = read_entry(this,(Hash *)&local_208,&local_1d8);
          pFVar11 = local_1d8.items.
                    super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pFVar10 = local_1d8.items.
                    super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pFVar9 = local_1d8.items.
                   super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar8 = local_1d8.name.str_._M_string_length;
          uVar7 = local_208.str_.field_2._M_allocated_capacity;
          sVar6 = local_208.str_._M_string_length;
          if (!bVar12) {
            bVar12 = fail_msg(this,"read_entry(entryKeyHash, entry)",pcVar14);
            std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::~vector(&local_1d8.items);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8.name.str_._M_dataplus._M_p != paVar1) {
              operator_delete(local_1d8.name.str_._M_dataplus._M_p,
                              CONCAT71(local_1d8.name.str_.field_2._M_allocated_capacity._1_7_,
                                       local_1d8.name.str_.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.str_._M_dataplus._M_p != paVar15) {
              operator_delete(local_208.str_._M_dataplus._M_p,
                              local_208.str_.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00114103;
          }
          local_128._0_4_ = local_208.hash_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.str_._M_dataplus._M_p == paVar15) {
            local_128._32_8_ = local_208.str_.field_2._8_8_;
            local_208.str_._M_dataplus._M_p = (pointer)paVar2;
          }
          local_208.str_._M_string_length = 0;
          local_208.str_.field_2._M_allocated_capacity =
               local_208.str_.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_e8 = '\x11';
          local_170._0_4_ = local_1d8.name.hash_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8.name.str_._M_dataplus._M_p == paVar1) {
            local_170._32_8_ = local_1d8.name.str_.field_2._8_8_;
            local_1d8.name.str_._M_dataplus._M_p = (pointer)paVar3;
          }
          local_170._25_7_ = local_1d8.name.str_.field_2._M_allocated_capacity._1_7_;
          local_170[0x18] = local_1d8.name.str_.field_2._M_local_buf[0];
          local_1d8.name.str_._M_string_length = 0;
          local_1d8.name.str_.field_2._M_local_buf[0] = '\0';
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_130 = '\x16';
          local_a0 = '\x11';
          local_e0._0_4_ = local_208.hash_;
          local_e0._8_8_ = local_208.str_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.str_._M_dataplus._M_p == paVar2) {
            local_e0._32_8_ = local_128._32_8_;
            local_e0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_e0 + 0x18);
          }
          local_e0._24_8_ = uVar7;
          local_e0._16_8_ = sVar6;
          local_128._16_8_ = 0;
          local_128._24_8_ = uVar7 & 0xffffffffffffff00;
          local_58 = '\x16';
          local_98._0_4_ = local_1d8.name.hash_;
          local_98._8_8_ = local_1d8.name.str_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8.name.str_._M_dataplus._M_p == paVar3) {
            local_98._32_8_ = local_170._32_8_;
            local_98._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_98 + 0x18);
          }
          local_98._24_8_ = local_170._24_8_;
          local_98._16_8_ = sVar8;
          local_170._16_8_ = 0;
          local_170._24_8_ =
               (ulong)(uint7)local_1d8.name.str_.field_2._M_allocated_capacity._1_7_ << 8;
          local_98._40_8_ = pFVar9;
          local_98._48_8_ = pFVar10;
          local_98._56_8_ = pFVar11;
          local_170._56_8_ = 0;
          local_170._40_8_ = 0;
          local_170._48_8_ = 0;
          local_208.str_._M_dataplus._M_p = (pointer)paVar15;
          local_1d8.name.str_._M_dataplus._M_p = (pointer)paVar1;
          local_170._8_8_ = paVar3;
          local_128._8_8_ = paVar2;
          std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::emplace_back<ritobin::Pair>
                    (&local_48,(Pair *)local_e0);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)local_98);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)local_e0);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)local_170);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)local_128);
          std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::~vector(&local_1d8.items);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8.name.str_._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d8.name.str_._M_dataplus._M_p,
                            CONCAT71(local_1d8.name.str_.field_2._M_allocated_capacity._1_7_,
                                     local_1d8.name.str_.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.str_._M_dataplus._M_p != &local_208.str_.field_2) {
            operator_delete(local_208.str_._M_dataplus._M_p,
                            local_208.str_.field_2._M_allocated_capacity + 1);
          }
          puVar13 = puVar13 + 1;
        } while (puVar13 != local_178);
      }
      bVar12 = true;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<char_const(&)[8],ritobin::Map>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this->bin,"entries",local_50);
LAB_00114103:
      std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::~vector(&local_48);
      goto LAB_00114110;
    }
    pcVar14 = "reader.read(entryNameHashes, entryCount)";
  }
  bVar12 = fail_msg(this,pcVar14,(char *)pos);
LAB_00114110:
  if (local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool read_entries() noexcept {
            uint32_t entryCount = 0;
            std::vector<uint32_t> entryNameHashes;
            bin_assert(reader.read(entryCount));
            bin_assert(reader.read(entryNameHashes, entryCount));
            Map entriesMap = { Type::HASH,  Type::EMBED, {} };
            for (uint32_t entryNameHash : entryNameHashes) {
                Hash entryKeyHash = {};
                Embed entry = { { entryNameHash }, {} };
                bin_assert(read_entry(entryKeyHash, entry));
                entriesMap.items.emplace_back(Pair{ std::move(entryKeyHash), std::move(entry) });
            }
            bin.sections.emplace("entries", std::move(entriesMap));
            return true;
        }